

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.cpp
# Opt level: O0

error<idx2::mmap_err_code> idx2::OpenFile(mmap_file *MMap,cstr Name,map_mode Mode)

{
  int iVar1;
  error<idx2::mmap_err_code> eVar2;
  mmap_file *local_60;
  mmap_err_code local_58;
  undefined2 uStack_54;
  anon_class_1_0_00000001 local_49;
  mmap_file *local_48;
  mmap_err_code local_40;
  undefined2 uStack_3c;
  anon_class_8_1_89809ba9 local_38;
  map_mode local_2c;
  cstr pcStack_28;
  map_mode Mode_local;
  cstr Name_local;
  mmap_file *MMap_local;
  mmap_err_code local_10;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  iVar1 = 0x242;
  if (Mode == Read) {
    iVar1 = 0;
  }
  local_2c = Mode;
  pcStack_28 = Name;
  Name_local = (cstr)MMap;
  iVar1 = open(Name,iVar1,0x180);
  *(int *)Name_local = iVar1;
  if (*(int *)Name_local == -1) {
    local_38.Name = &stack0xffffffffffffffd8;
    eVar2 = OpenFile::anon_class_8_1_89809ba9::operator()(&local_38);
    local_48 = (mmap_file *)eVar2.Msg;
    MMap_local = local_48;
    local_40 = eVar2.Code;
    local_10 = local_40;
    uStack_3c = eVar2._12_2_;
    uStack_c = uStack_3c;
  }
  else {
    *(map_mode *)(Name_local + 8) = local_2c;
    eVar2 = OpenFile::anon_class_1_0_00000001::operator()(&local_49);
    local_60 = (mmap_file *)eVar2.Msg;
    MMap_local = local_60;
    local_58 = eVar2.Code;
    local_10 = local_58;
    uStack_54 = eVar2._12_2_;
    uStack_c = uStack_54;
  }
  eVar2.Code = local_10;
  eVar2.Msg = (cstr)MMap_local;
  eVar2.StackIdx = (undefined1)uStack_c;
  eVar2.StrGened = (bool)uStack_c._1_1_;
  eVar2._14_2_ = uStack_a;
  return eVar2;
}

Assistant:

error<mmap_err_code>
OpenFile(mmap_file* MMap, cstr Name, map_mode Mode)
{
#if defined(_WIN32)
  MMap->File = CreateFileA(Name,
                           Mode == map_mode::Read ? GENERIC_READ : GENERIC_READ | GENERIC_WRITE,
                           0,
                           NULL,
                           OPEN_ALWAYS,
                           FILE_ATTRIBUTE_NORMAL,
                           NULL);
  if (MMap->File == INVALID_HANDLE_VALUE)
    return idx2_Error(mmap_err_code::FileCreateFailed, "file: %s\n", Name);
#elif defined(__CYGWIN__) || defined(__linux__) || defined(__APPLE__)
  MMap->File = open(Name, Mode == map_mode::Read ? O_RDONLY : O_RDWR | O_CREAT | O_TRUNC, 0600);
  if (MMap->File == -1)
    return idx2_Error(mmap_err_code::FileCreateFailed, "file: %s\n", Name);
#endif
  MMap->Mode = Mode;
  return idx2_Error(mmap_err_code::NoError);
}